

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O1

void __thiscall
ylt::metric::basic_static_counter<double>::serialize(basic_static_counter<double> *this,string *str)

{
  atomic<std::atomic<double>_*> *t;
  pointer paVar1;
  double value;
  
  value = 0.0;
  for (paVar1 = (this->default_label_value_).duplicates_.
                super__Vector_base<std::atomic<std::atomic<double>_*>,_std::allocator<std::atomic<std::atomic<double>_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar1 != (this->default_label_value_).duplicates_.
                super__Vector_base<std::atomic<std::atomic<double>_*>,_std::allocator<std::atomic<std::atomic<double>_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; paVar1 = paVar1 + 1) {
    if ((paVar1->_M_b)._M_p != (__pointer_type)0x0) {
      value = value + (((paVar1->_M_b)._M_p)->super___atomic_float<double>)._M_fp;
    }
  }
  if (((value == 0.0) && (!NAN(value))) && (this->has_change_ != true)) {
    return;
  }
  metric_t::serialize_head((metric_t *)this,str);
  serialize_default_label(this,str,value);
  return;
}

Assistant:

void serialize(std::string &str) override {
    auto value = default_label_value_.value();
    if (value == 0 && !has_change_) {
      return;
    }

    metric_t::serialize_head(str);
    serialize_default_label(str, value);
  }